

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.h
# Opt level: O0

void __thiscall jrtplib::RTPSourceStats::RTPSourceStats(RTPSourceStats *this)

{
  RTPSourceStats *this_local;
  
  RTPTime::RTPTime(&this->prevpacktime,0,0);
  RTPTime::RTPTime(&this->lastmsgtime,0,0);
  RTPTime::RTPTime(&this->lastrtptime,0,0);
  RTPTime::RTPTime(&this->lastnotetime,0,0);
  this->sentdata = false;
  this->packetsreceived = 0;
  this->baseseqnr = 0;
  this->exthighseqnr = 0;
  this->prevexthighseqnr = 0;
  this->jitter = 0;
  this->numcycles = 0;
  this->numnewpackets = 0;
  this->prevtimestamp = 0;
  this->djitter = 0.0;
  this->savedextseqnr = 0;
  this->probation = 0;
  this->prevseqnr = 0;
  return;
}

Assistant:

inline RTPSourceStats::RTPSourceStats():prevpacktime(0,0),lastmsgtime(0,0),lastrtptime(0,0),lastnotetime(0,0)
{ 
	sentdata = false; 
	packetsreceived = 0; 
	baseseqnr = 0; 
	exthighseqnr = 0; 
	prevexthighseqnr = 0; 
	jitter = 0; 
	numcycles = 0;
	numnewpackets = 0;
	prevtimestamp = 0;
	djitter = 0;
	savedextseqnr = 0;
#ifdef RTP_SUPPORT_PROBATION
	probation = 0; 
	prevseqnr = 0; 
#endif // RTP_SUPPORT_PROBATION
}